

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

bool __thiscall graphics101::Mesh::writeToOBJ(Mesh *this,string *path)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  reference this_00;
  reference pvVar7;
  float *pfVar8;
  reference pTVar9;
  reference pvVar10;
  reference pvVar11;
  reference this_01;
  ostream *poVar12;
  int *piVar13;
  value_type *n_1;
  value_type *t_1;
  value_type *p_2;
  int face_index_2;
  value_type *n;
  value_type *p_1;
  int face_index_1;
  value_type *t;
  value_type *p;
  int face_index;
  Triangle *face;
  iterator __end2_3;
  iterator __begin2_3;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range2_3;
  vec<3,_float,_(glm::qualifier)0> *vn;
  iterator __end1_2;
  iterator __begin1_2;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__range1_2;
  vec<2,_float,_(glm::qualifier)0> *vt;
  iterator __end1_1;
  iterator __begin1_1;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *__range1_1;
  vec<3,_float,_(glm::qualifier)0> *v;
  iterator __end1;
  iterator __begin1;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__range1;
  long local_2a0;
  ofstream out;
  int local_9c;
  int vi_2;
  Triangle *f_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range2_2;
  bool valid_indices_2;
  int vi_1;
  Triangle *f_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range2_1;
  bool valid_indices_1;
  int vi;
  Triangle *f;
  iterator __end2;
  iterator __begin2;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range2;
  bool valid_indices;
  string *path_local;
  Mesh *this_local;
  
  sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                    (&this->face_normals);
  if (sVar5 != 0) {
    sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                      (&this->face_normals);
    sVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                      (&this->face_positions);
    if (sVar5 != sVar6) {
      std::operator<<((ostream *)&std::cerr,
                      "ERROR: Faces for normals don\'t match faces for positions. Can\'t write mesh to OBJ.\n"
                     );
      return false;
    }
  }
  sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                    (&this->face_texcoords);
  if (sVar5 != 0) {
    sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                      (&this->face_texcoords);
    sVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                      (&this->face_positions);
    if (sVar5 != sVar6) {
      std::operator<<((ostream *)&std::cerr,
                      "ERROR: Faces for texture coordinates don\'t match faces for positions. Can\'t write mesh to OBJ.\n"
                     );
      return false;
    }
  }
  bVar4 = true;
  __end2 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::begin
                     (&this->face_positions);
  f = (Triangle *)
      std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::end
                (&this->face_positions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                                     *)&f), bVar2) {
    pTVar9 = __gnu_cxx::
             __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
             ::operator*(&__end2);
    for (__range2_1._4_4_ = 0; __range2_1._4_4_ < 3; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
      piVar13 = Triangle::operator[](pTVar9,__range2_1._4_4_);
      if (*piVar13 < 0) {
LAB_001475a3:
        bVar4 = false;
      }
      else {
        piVar13 = Triangle::operator[](pTVar9,__range2_1._4_4_);
        iVar1 = *piVar13;
        sVar5 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::size(&this->positions);
        if (sVar5 <= (ulong)(long)iVar1) goto LAB_001475a3;
      }
    }
    __gnu_cxx::
    __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
    ::operator++(&__end2);
  }
  if (!bVar4) {
    std::operator<<((ostream *)&std::cerr,
                    "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n"
                   );
  }
  bVar4 = true;
  __end2_1 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::begin
                       (&this->face_normals);
  f_1 = (Triangle *)
        std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::end
                  (&this->face_normals);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                             *)&f_1), bVar2) {
    pTVar9 = __gnu_cxx::
             __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
             ::operator*(&__end2_1);
    for (__range2_2._4_4_ = 0; __range2_2._4_4_ < 3; __range2_2._4_4_ = __range2_2._4_4_ + 1) {
      piVar13 = Triangle::operator[](pTVar9,__range2_2._4_4_);
      if (*piVar13 < 0) {
LAB_00147680:
        bVar4 = false;
      }
      else {
        piVar13 = Triangle::operator[](pTVar9,__range2_2._4_4_);
        iVar1 = *piVar13;
        sVar5 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::size(&this->normals);
        if (sVar5 <= (ulong)(long)iVar1) goto LAB_00147680;
      }
    }
    __gnu_cxx::
    __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
    ::operator++(&__end2_1);
  }
  if (!bVar4) {
    std::operator<<((ostream *)&std::cerr,
                    "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n"
                   );
  }
  bVar4 = true;
  __end2_2 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::begin
                       (&this->face_texcoords);
  f_2 = (Triangle *)
        std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::end
                  (&this->face_texcoords);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                        *)&f_2);
    if (!bVar2) {
      if (!bVar4) {
        std::operator<<((ostream *)&std::cerr,
                        "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n"
                       );
      }
      std::ofstream::ofstream(&local_2a0,(string *)path,_S_out);
      bVar3 = std::ios::operator!((ios *)((long)&local_2a0 + *(long *)(local_2a0 + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::operator<<((ostream *)&local_2a0,"# OBJ written by Mesh::writeToOBJ()\n");
        std::ios_base::precision((ios_base *)((long)&local_2a0 + *(long *)(local_2a0 + -0x18)),0x20)
        ;
        std::operator<<((ostream *)&local_2a0,'\n');
        __end1 = std::
                 vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ::begin(&this->positions);
        v = (vec<3,_float,_(glm::qualifier)0> *)
            std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::end(&this->positions);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                                           *)&v), bVar4) {
          pvVar7 = __gnu_cxx::
                   __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::operator*(&__end1);
          poVar12 = std::operator<<((ostream *)&local_2a0,"v ");
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,0);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          poVar12 = std::operator<<(poVar12,' ');
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,1);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          poVar12 = std::operator<<(poVar12,' ');
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,2);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          std::operator<<(poVar12,'\n');
          __gnu_cxx::
          __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
          ::operator++(&__end1);
        }
        std::operator<<((ostream *)&local_2a0,'\n');
        __end1_1 = std::
                   vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ::begin(&this->texcoords);
        vt = (vec<2,_float,_(glm::qualifier)0> *)
             std::
             vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ::end(&this->texcoords);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
                                   *)&vt), bVar4) {
          this_00 = __gnu_cxx::
                    __normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
                    ::operator*(&__end1_1);
          poVar12 = std::operator<<((ostream *)&local_2a0,"vt ");
          pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](this_00,0);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          poVar12 = std::operator<<(poVar12,' ');
          pfVar8 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](this_00,1);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          std::operator<<(poVar12,'\n');
          __gnu_cxx::
          __normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
          ::operator++(&__end1_1);
        }
        std::operator<<((ostream *)&local_2a0,'\n');
        __end1_2 = std::
                   vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ::begin(&this->normals);
        vn = (vec<3,_float,_(glm::qualifier)0> *)
             std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::end(&this->normals);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end1_2,
                                  (__normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                                   *)&vn), bVar4) {
          pvVar7 = __gnu_cxx::
                   __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::operator*(&__end1_2);
          poVar12 = std::operator<<((ostream *)&local_2a0,"vn ");
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,0);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          poVar12 = std::operator<<(poVar12,' ');
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,1);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          poVar12 = std::operator<<(poVar12,' ');
          pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar7,2);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar8);
          std::operator<<(poVar12,'\n');
          __gnu_cxx::
          __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
          ::operator++(&__end1_2);
        }
        std::operator<<((ostream *)&local_2a0,'\n');
        bVar4 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::empty
                          (&this->face_texcoords);
        if ((bVar4) &&
           (bVar4 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                    empty(&this->face_normals), bVar4)) {
          __end2_3 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                     begin(&this->face_positions);
          face = (Triangle *)
                 std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::end
                           (&this->face_positions);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end2_3,
                                    (__normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                                     *)&face), bVar4) {
            pTVar9 = __gnu_cxx::
                     __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                     ::operator*(&__end2_3);
            poVar12 = std::operator<<((ostream *)&local_2a0,"f ");
            piVar13 = Triangle::operator[](pTVar9,0);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
            poVar12 = std::operator<<(poVar12,' ');
            piVar13 = Triangle::operator[](pTVar9,1);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
            poVar12 = std::operator<<(poVar12,' ');
            piVar13 = Triangle::operator[](pTVar9,2);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
            std::operator<<(poVar12,'\n');
            __gnu_cxx::
            __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
            ::operator++(&__end2_3);
          }
        }
        else {
          bVar4 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::empty
                            (&this->face_normals);
          if (bVar4) {
            for (p._4_4_ = 0;
                sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                        size(&this->face_positions), (ulong)(long)p._4_4_ < sVar5;
                p._4_4_ = p._4_4_ + 1) {
              pvVar10 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                        at(&this->face_positions,(long)p._4_4_);
              pvVar11 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                        at(&this->face_texcoords,(long)p._4_4_);
              poVar12 = std::operator<<((ostream *)&local_2a0,"f ");
              piVar13 = Triangle::operator[](pvVar10,0);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              poVar12 = std::operator<<(poVar12,'/');
              piVar13 = Triangle::operator[](pvVar11,0);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              poVar12 = std::operator<<(poVar12,' ');
              piVar13 = Triangle::operator[](pvVar10,1);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              poVar12 = std::operator<<(poVar12,'/');
              piVar13 = Triangle::operator[](pvVar11,1);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              poVar12 = std::operator<<(poVar12,' ');
              piVar13 = Triangle::operator[](pvVar10,2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              poVar12 = std::operator<<(poVar12,'/');
              piVar13 = Triangle::operator[](pvVar11,2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
              std::operator<<(poVar12,'\n');
            }
          }
          else {
            bVar4 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                    empty(&this->face_texcoords);
            if (bVar4) {
              for (p_1._4_4_ = 0;
                  sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::size(&this->face_positions), (ulong)(long)p_1._4_4_ < sVar5;
                  p_1._4_4_ = p_1._4_4_ + 1) {
                pvVar10 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::at(&this->face_positions,(long)p_1._4_4_);
                pvVar11 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::at(&this->face_normals,(long)p_1._4_4_);
                poVar12 = std::operator<<((ostream *)&local_2a0,"f ");
                piVar13 = Triangle::operator[](pvVar10,0);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,"//");
                piVar13 = Triangle::operator[](pvVar11,0);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,' ');
                piVar13 = Triangle::operator[](pvVar10,1);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,"//");
                piVar13 = Triangle::operator[](pvVar11,1);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,' ');
                piVar13 = Triangle::operator[](pvVar10,2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,"//");
                piVar13 = Triangle::operator[](pvVar11,2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                std::operator<<(poVar12,'\n');
              }
            }
            else {
              for (p_2._4_4_ = 0;
                  sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::size(&this->face_positions), (ulong)(long)p_2._4_4_ < sVar5;
                  p_2._4_4_ = p_2._4_4_ + 1) {
                pvVar10 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::at(&this->face_positions,(long)p_2._4_4_);
                pvVar11 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::at(&this->face_texcoords,(long)p_2._4_4_);
                this_01 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::at(&this->face_normals,(long)p_2._4_4_);
                poVar12 = std::operator<<((ostream *)&local_2a0,"f ");
                piVar13 = Triangle::operator[](pvVar10,0);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](pvVar11,0);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](this_01,0);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,' ');
                piVar13 = Triangle::operator[](pvVar10,1);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](pvVar11,1);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](this_01,1);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,' ');
                piVar13 = Triangle::operator[](pvVar10,2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](pvVar11,2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                poVar12 = std::operator<<(poVar12,'/');
                piVar13 = Triangle::operator[](this_01,2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar13 + 1);
                std::operator<<(poVar12,'\n');
              }
            }
          }
        }
        this_local._7_1_ = true;
      }
      else {
        poVar12 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not open file for writing: ");
        poVar12 = std::operator<<(poVar12,(string *)path);
        std::operator<<(poVar12,'\n');
        this_local._7_1_ = false;
      }
      std::ofstream::~ofstream(&local_2a0);
      return this_local._7_1_;
    }
    pTVar9 = __gnu_cxx::
             __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
             ::operator*(&__end2_2);
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      piVar13 = Triangle::operator[](pTVar9,local_9c);
      if (*piVar13 < 0) {
LAB_00147778:
        bVar4 = false;
      }
      else {
        piVar13 = Triangle::operator[](pTVar9,local_9c);
        iVar1 = *piVar13;
        sVar5 = std::
                vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ::size(&this->texcoords);
        if (sVar5 <= (ulong)(long)iVar1) goto LAB_00147778;
      }
    }
    __gnu_cxx::
    __normal_iterator<graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
    ::operator++(&__end2_2);
  } while( true );
}

Assistant:

bool Mesh::writeToOBJ( const std::string& path ) {
    using namespace std;
    
    if( face_normals.size() > 0 && face_normals.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for normals don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    if( face_texcoords.size() > 0 && face_texcoords.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for texture coordinates don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    
    // Check for valid position indices in face_positions.
    {
        bool valid_indices = true;
        for( const auto& f : face_positions ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= positions.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid normal indices in face_normals.
    {
        bool valid_indices = true;
        for( const auto& f : face_normals ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= normals.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid texture coordinate indices in face_texcoords.
    {
        bool valid_indices = true;
        for( const auto& f : face_texcoords ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= texcoords.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    
    // Open the file.
    ofstream out( path );
    if( !out ) {
        cerr << "ERROR: Could not open file for writing: " << path << '\n';
        return false;
    }
    
    out << "# OBJ written by Mesh::writeToOBJ()\n";
    out.precision( 32 );
    
    out << '\n';
    for( const auto& v : positions ) {
        out << "v " << v[0] << ' ' << v[1] << ' ' << v[2] << '\n';
    }
    
    out << '\n';
    for( const auto& vt : texcoords ) {
        out << "vt " << vt[0] << ' ' << vt[1] << '\n';
    }
    
    out << '\n';
    for( const auto& vn : normals ) {
        out << "vn " << vn[0] << ' ' << vn[1] << ' ' << vn[2] << '\n';
    }
    
    // OBJ's are 1-indexed, so add one to all indices.
    
    out << '\n';
    if( face_texcoords.empty() && face_normals.empty() ) {
        for( const auto& face : face_positions ) {
            out << "f " << face[0]+1 << ' ' << face[1]+1 << ' ' << face[2]+1 << '\n';
        }
    }
    else if( face_normals.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '\n';
        }
    }
    else if( face_texcoords.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << "//" << n[0]+1 << ' '
                << p[1]+1 << "//" << n[1]+1 << ' '
                << p[2]+1 << "//" << n[2]+1 << '\n';
        }
    }
    else {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << '/' << n[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << '/' << n[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '/' << n[2]+1 << '\n';
        }
    }

    return true;
}